

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_bfop_reg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 arg1;
  uint16_t uVar1;
  ushort uVar2;
  uint value;
  uint32_t uVar3;
  int arg;
  uint word;
  uint32_t val;
  TCGv_i32 ret;
  TCGv_i32 tmp;
  TCGv_i32 pTStack_58;
  uint32_t maski;
  TCGv_i32 tlen;
  TCGv_i32 tofs;
  TCGv_i32 mask;
  int ofs;
  int len;
  TCGv_i32 src;
  int ext;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = read_im16(env,s);
  value = (uint)uVar1;
  arg1 = tcg_ctx_00->cpu_dregs[(int)(insn & 7)];
  uVar3 = extract32(value,0,5);
  arg = (uVar3 - 1 & 0x1f) + 1;
  uVar3 = extract32(value,6,5);
  tlen = (TCGv_i32)0x0;
  pTStack_58 = (TCGv_i32)0x0;
  if ((insn & 0xf00) == 0xd00) {
    tlen = tcg_temp_new_i32(tcg_ctx_00);
    pTStack_58 = tcg_temp_new_i32(tcg_ctx_00);
  }
  if ((uVar1 & 0x820) == 0) {
    word = 0x7fffffff >> ((char)arg - 1U & 0x1f);
    if ((int)(uVar3 + arg) < 0x21) {
      tcg_gen_shli_i32_m68k(tcg_ctx_00,QREG_CC_N,arg1,uVar3);
    }
    else {
      tcg_gen_rotli_i32_m68k(tcg_ctx_00,QREG_CC_N,arg1,uVar3);
    }
    tcg_gen_andi_i32_m68k(tcg_ctx_00,QREG_CC_N,QREG_CC_N,word ^ 0xffffffff);
    val = ror32(word,uVar3);
    tofs = tcg_const_i32_m68k(tcg_ctx_00,val);
    if (tlen != (TCGv_i32)0x0) {
      tcg_gen_movi_i32(tcg_ctx_00,tlen,uVar3);
      tcg_gen_movi_i32(tcg_ctx_00,pTStack_58,arg);
    }
  }
  else {
    ret = tcg_temp_new_i32(tcg_ctx_00);
    if ((uVar1 & 0x20) == 0) {
      tofs = tcg_const_i32_m68k(tcg_ctx_00,0x7fffffff >> ((char)arg - 1U & 0x1f));
      if (pTStack_58 != (TCGv_i32)0x0) {
        tcg_gen_movi_i32(tcg_ctx_00,pTStack_58,arg);
      }
    }
    else {
      tcg_gen_subi_i32_m68k(tcg_ctx_00,ret,tcg_ctx_00->cpu_dregs[(int)(value & 7)],1);
      tcg_gen_andi_i32_m68k(tcg_ctx_00,ret,ret,0x1f);
      tofs = tcg_const_i32_m68k(tcg_ctx_00,0x7fffffff);
      tcg_gen_shr_i32(tcg_ctx_00,tofs,tofs,ret);
      if (pTStack_58 != (TCGv_i32)0x0) {
        tcg_gen_addi_i32_m68k(tcg_ctx_00,pTStack_58,ret,1);
      }
    }
    if ((uVar1 & 0x800) == 0) {
      tcg_gen_rotli_i32_m68k(tcg_ctx_00,QREG_CC_N,arg1,uVar3);
      tcg_gen_andc_i32_m68k(tcg_ctx_00,QREG_CC_N,QREG_CC_N,tofs);
      tcg_gen_rotri_i32_m68k(tcg_ctx_00,tofs,tofs,uVar3);
      if (tlen != (TCGv_i32)0x0) {
        tcg_gen_movi_i32(tcg_ctx_00,tlen,uVar3);
      }
    }
    else {
      tcg_gen_andi_i32_m68k(tcg_ctx_00,ret,tcg_ctx_00->cpu_dregs[(int)((int)value >> 6 & 7)],0x1f);
      tcg_gen_rotl_i32_m68k(tcg_ctx_00,QREG_CC_N,arg1,ret);
      tcg_gen_andc_i32_m68k(tcg_ctx_00,QREG_CC_N,QREG_CC_N,tofs);
      tcg_gen_rotr_i32_m68k(tcg_ctx_00,tofs,tofs,ret);
      if (tlen != (TCGv_i32)0x0) {
        tcg_gen_mov_i32(tcg_ctx_00,tlen,ret);
      }
    }
    tcg_temp_free_i32(tcg_ctx_00,ret);
  }
  set_cc_op(s,CC_OP_LOGIC);
  uVar2 = insn & 0xf00;
  if (uVar2 != 0x800) {
    if (uVar2 == 0xa00) {
      tcg_gen_eqv_i32_m68k(tcg_ctx_00,arg1,arg1,tofs);
    }
    else if (uVar2 == 0xc00) {
      tcg_gen_and_i32(tcg_ctx_00,arg1,arg1,tofs);
    }
    else if (uVar2 == 0xd00) {
      gen_helper_bfffo_reg
                (tcg_ctx_00,tcg_ctx_00->cpu_dregs[(int)((int)value >> 0xc & 7)],QREG_CC_N,tlen,
                 pTStack_58);
      tcg_temp_free_i32(tcg_ctx_00,pTStack_58);
      tcg_temp_free_i32(tcg_ctx_00,tlen);
    }
    else {
      if (uVar2 != 0xe00) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
                   ,0x1107,(char *)0x0);
      }
      tcg_gen_orc_i32_m68k(tcg_ctx_00,arg1,arg1,tofs);
    }
  }
  tcg_temp_free_i32(tcg_ctx_00,tofs);
  return;
}

Assistant:

DISAS_INSN(bfop_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int ext = read_im16(env, s);
    TCGv src = DREG(insn, 0);
    int len = ((extract32(ext, 0, 5) - 1) & 31) + 1;
    int ofs = extract32(ext, 6, 5);  /* big bit-endian */
    TCGv mask, tofs, tlen;

    tofs = NULL;
    tlen = NULL;
    if ((insn & 0x0f00) == 0x0d00) { /* bfffo */
        tofs = tcg_temp_new(tcg_ctx);
        tlen = tcg_temp_new(tcg_ctx);
    }

    if ((ext & 0x820) == 0) {
        /* Immediate width and offset.  */
        uint32_t maski = 0x7fffffffu >> (len - 1);
        if (ofs + len <= 32) {
            tcg_gen_shli_i32(tcg_ctx, QREG_CC_N, src, ofs);
        } else {
            tcg_gen_rotli_i32(tcg_ctx, QREG_CC_N, src, ofs);
        }
        tcg_gen_andi_i32(tcg_ctx, QREG_CC_N, QREG_CC_N, ~maski);
        mask = tcg_const_i32(tcg_ctx, ror32(maski, ofs));
        if (tofs) {
            tcg_gen_movi_i32(tcg_ctx, tofs, ofs);
            tcg_gen_movi_i32(tcg_ctx, tlen, len);
        }
    } else {
        TCGv tmp = tcg_temp_new(tcg_ctx);
        if (ext & 0x20) {
            /* Variable width */
            tcg_gen_subi_i32(tcg_ctx, tmp, DREG(ext, 0), 1);
            tcg_gen_andi_i32(tcg_ctx, tmp, tmp, 31);
            mask = tcg_const_i32(tcg_ctx, 0x7fffffffu);
            tcg_gen_shr_i32(tcg_ctx, mask, mask, tmp);
            if (tlen) {
                tcg_gen_addi_i32(tcg_ctx, tlen, tmp, 1);
            }
        } else {
            /* Immediate width */
            mask = tcg_const_i32(tcg_ctx, 0x7fffffffu >> (len - 1));
            if (tlen) {
                tcg_gen_movi_i32(tcg_ctx, tlen, len);
            }
        }
        if (ext & 0x800) {
            /* Variable offset */
            tcg_gen_andi_i32(tcg_ctx, tmp, DREG(ext, 6), 31);
            tcg_gen_rotl_i32(tcg_ctx, QREG_CC_N, src, tmp);
            tcg_gen_andc_i32(tcg_ctx, QREG_CC_N, QREG_CC_N, mask);
            tcg_gen_rotr_i32(tcg_ctx, mask, mask, tmp);
            if (tofs) {
                tcg_gen_mov_i32(tcg_ctx, tofs, tmp);
            }
        } else {
            /* Immediate offset (and variable width) */
            tcg_gen_rotli_i32(tcg_ctx, QREG_CC_N, src, ofs);
            tcg_gen_andc_i32(tcg_ctx, QREG_CC_N, QREG_CC_N, mask);
            tcg_gen_rotri_i32(tcg_ctx, mask, mask, ofs);
            if (tofs) {
                tcg_gen_movi_i32(tcg_ctx, tofs, ofs);
            }
        }
        tcg_temp_free(tcg_ctx, tmp);
    }
    set_cc_op(s, CC_OP_LOGIC);

    switch (insn & 0x0f00) {
    case 0x0a00: /* bfchg */
        tcg_gen_eqv_i32(tcg_ctx, src, src, mask);
        break;
    case 0x0c00: /* bfclr */
        tcg_gen_and_i32(tcg_ctx, src, src, mask);
        break;
    case 0x0d00: /* bfffo */
        gen_helper_bfffo_reg(tcg_ctx, DREG(ext, 12), QREG_CC_N, tofs, tlen);
        tcg_temp_free(tcg_ctx, tlen);
        tcg_temp_free(tcg_ctx, tofs);
        break;
    case 0x0e00: /* bfset */
        tcg_gen_orc_i32(tcg_ctx, src, src, mask);
        break;
    case 0x0800: /* bftst */
        /* flags already set; no other work to do.  */
        break;
    default:
        g_assert_not_reached();
    }
    tcg_temp_free(tcg_ctx, mask);
}